

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

SchnorrSignature *
cfd::core::SchnorrUtil::Sign(SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk)

{
  ByteData local_38;
  Privkey *local_20;
  Privkey *sk_local;
  ByteData256 *msg_local;
  
  local_20 = sk;
  sk_local = (Privkey *)msg;
  msg_local = (ByteData256 *)__return_storage_ptr__;
  ByteData::ByteData(&local_38);
  SignCommon(__return_storage_ptr__,msg,sk,(secp256k1_nonce_function_hardened *)0x0,&local_38);
  ByteData::~ByteData(&local_38);
  return __return_storage_ptr__;
}

Assistant:

SchnorrSignature SchnorrUtil::Sign(const ByteData256 &msg, const Privkey &sk) {
  return SignCommon(msg, sk, nullptr, ByteData());
}